

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

void xmlListReverse(xmlListPtr l)

{
  xmlLinkPtr pxVar1;
  _xmlLink *p_Var2;
  xmlLinkPtr pxVar3;
  
  if (l != (xmlListPtr)0x0) {
    pxVar1 = l->sentinel;
    pxVar3 = pxVar1;
    do {
      p_Var2 = pxVar3->next;
      pxVar3->next = pxVar3->prev;
      pxVar3->prev = p_Var2;
      pxVar3 = p_Var2;
    } while (p_Var2 != pxVar1);
  }
  return;
}

Assistant:

void
xmlListReverse(xmlListPtr l)
{
    xmlLinkPtr lk;
    xmlLinkPtr lkPrev;

    if (l == NULL)
        return;
    lkPrev = l->sentinel;
    for (lk = l->sentinel->next; lk != l->sentinel; lk = lk->next) {
        lkPrev->next = lkPrev->prev;
        lkPrev->prev = lk;
        lkPrev = lk;
    }
    /* Fix up the last node */
    lkPrev->next = lkPrev->prev;
    lkPrev->prev = lk;
}